

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_private_key_result_t
sign_finish(ptls_sign_certificate_t *do_sign,ptls_t *tls,uint16_t *selected_algorithm,
           ptls_buffer_t *output)

{
  uint uVar1;
  ptls_iovec_t pVar2;
  int rc;
  ptls_buffer_t *output_local;
  uint16_t *selected_algorithm_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *do_sign_local;
  
  msg("sign_finish");
  retry_count = retry_count + 1;
  if (retry_count < 3) {
    msg("retry again");
    do_sign_local._4_4_ = ptls_private_key_retry;
  }
  else {
    pVar2.len = in.len;
    pVar2.base = in.base;
    uVar1 = (*do_sign->cb)(do_sign,tls,selected_algorithm,output,pVar2,algos,num_algos);
    free(in.base);
    free(algos);
    msg("sign_finish ret: %d",(ulong)uVar1);
    if (uVar1 == 0) {
      do_sign_local._4_4_ = ptls_private_key_success;
    }
    else {
      do_sign_local._4_4_ = ptls_private_key_failure;
    }
  }
  return do_sign_local._4_4_;
}

Assistant:

enum ptls_private_key_result_t sign_finish(ptls_sign_certificate_t *do_sign,
                                           ptls_t *tls,
                                           uint16_t *selected_algorithm,
                                           ptls_buffer_t *output)
{
    msg("sign_finish");
    ++retry_count;
    if (retry_count <= 2)
    {
        msg("retry again");
        return ptls_private_key_retry;
    }
    int rc = do_sign->cb(do_sign, tls, selected_algorithm, output, in, algos,
                         num_algos);
    free(in.base);
    free(algos);
    msg("sign_finish ret: %d", rc);
    if (rc == 0)
        return ptls_private_key_success;
    return ptls_private_key_failure;
}